

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

basic_substring<char> __thiscall
c4::basic_substring<char>::trimr(basic_substring<char> *this,ro_substr chars)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  basic_substring<char> bVar8;
  basic_substring<char> local_20;
  
  pcVar4 = this->str;
  uVar1 = this->len;
  if (pcVar4 == (char *)0x0 || uVar1 == 0) {
LAB_002319f6:
    sVar5 = 0;
  }
  else {
    uVar6 = uVar1 - 1;
    if (chars.len == 0) {
LAB_00231a2a:
      sVar5 = uVar6 + 1;
      if (sVar5 != 0xffffffffffffffff && uVar1 <= uVar6) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          bVar8 = (basic_substring<char>)(*pcVar2)();
          return bVar8;
        }
        handle_error(0x2467aa,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
      }
      if (sVar5 == 0xffffffffffffffff) {
        sVar5 = uVar1;
      }
      if (uVar1 < sVar5) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar3 = is_debugger_attached(), bVar3)) {
          pcVar2 = (code *)swi(3);
          bVar8 = (basic_substring<char>)(*pcVar2)();
          return bVar8;
        }
        handle_error(0x2467aa,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
      }
      basic_substring(&local_20,this->str,sVar5);
      pcVar4 = local_20.str;
      sVar5 = local_20.len;
    }
    else {
      sVar5 = 0;
      do {
        sVar7 = 0;
        while (pcVar4[uVar6] != chars.str[sVar7]) {
          sVar7 = sVar7 + 1;
          if (chars.len == sVar7) {
            if (uVar6 == 0xffffffffffffffff) goto LAB_002319f6;
            goto LAB_00231a2a;
          }
        }
        bVar3 = uVar6 != 0;
        uVar6 = uVar6 - 1;
      } while (bVar3);
    }
  }
  bVar8.len = sVar5;
  bVar8.str = pcVar4;
  return bVar8;
}

Assistant:

basic_substring trimr(ro_substr chars) const
    {
        if( ! empty())
        {
            size_t pos = last_not_of(chars, npos);
            if(pos != npos)
                return sub(0, pos+1);
        }
        return sub(0, 0);
    }